

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O1

void __thiscall V2Chan::set(V2Chan *this,syVChan *para)

{
  float fVar1;
  
  this->aarcv = para->auxarcv * 0.0078125;
  this->abrcv = para->auxbrcv * 0.0078125;
  this->aasnd = para->auxasnd * 0.0078125 * 0.6;
  this->absnd = para->auxbsnd * 0.0078125 * 0.6;
  fVar1 = para->chanvol * 0.0078125 * 0.6;
  this->chgain = fVar1;
  fVar1 = fVar1 * 0.6;
  this->a1gain = para->aux1 * 0.0078125 * fVar1;
  this->a2gain = para->aux2 * 0.0078125 * fVar1;
  this->fxr = (int)para->fxroute;
  V2Dist::set(&this->dist,&para->dist);
  V2ModDel::set(&this->chorus,&para->chorus);
  V2Comp::set(&this->comp,&para->comp);
  V2Boost::set(&this->boost,&para->boost);
  return;
}

Assistant:

void set(const syVChan *para)
    {
        aarcv = para->auxarcv / 128.0f;
        abrcv = para->auxbrcv / 128.0f;
        aasnd = fcgain * (para->auxasnd / 128.0f);
        absnd = fcgain * (para->auxbsnd / 128.0f);
        chgain = fcgain * (para->chanvol / 128.0f);
        a1gain = chgain * fcgainh * (para->aux1 / 128.0f);
        a2gain = chgain * fcgainh * (para->aux2 / 128.0f);
        fxr = (int)para->fxroute;
        dist.set(&para->dist);
        chorus.set(&para->chorus);
        comp.set(&para->comp);
        boost.set(&para->boost);
    }